

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

bool __thiscall
benchmark::internal::BenchmarkFamilies::FindBenchmarks
          (BenchmarkFamilies *this,string *spec,
          vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          *benchmarks)

{
  uint uVar1;
  int iVar2;
  Benchmark *pBVar3;
  BenchmarkImp *pBVar4;
  bool bVar5;
  bool bVar6;
  pointer puVar7;
  ostream *poVar8;
  uint *puVar9;
  uint *puVar10;
  pointer ppVar11;
  Instance instance;
  MutexLock l;
  string error_msg;
  vector<int,_std::allocator<int>_> one_thread;
  Regex re;
  string local_138;
  pointer local_118;
  value_type local_110;
  pointer local_c0;
  pointer local_b8;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *local_b0;
  unique_lock<std::mutex> local_a8;
  string local_98;
  vector<int,_std::allocator<int>_> local_78;
  Regex local_58;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b0 = benchmarks;
  Regex::Regex(&local_58);
  bVar5 = Regex::Init(&local_58,spec,&local_98);
  if (bVar5) {
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_110.name._M_dataplus._M_p._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_78,(iterator)0x0,(int *)&local_110);
    local_a8._M_device = &(this->mutex_).mut_;
    local_a8._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_a8);
    local_a8._M_owns = true;
    puVar7 = (this->families_).
             super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c0 = (this->families_).
               super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 != local_c0) {
      do {
        pBVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                 .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
        local_118 = puVar7;
        if (pBVar3 != (Benchmark *)0x0) {
          pBVar4 = pBVar3->imp_;
          if (pBVar4->arg_count_ == -1) {
            pBVar4->arg_count_ = 0;
            local_110.name._M_dataplus._M_p._0_4_ = 0xffffffff;
            local_138._M_dataplus._M_p._0_4_ = 0xffffffff;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<int,int>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                       &pBVar4->args_,(int *)&local_110,(int *)&local_138);
          }
          ppVar11 = *(pointer *)
                     &(pBVar4->args_).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl;
          local_b8 = *(pointer *)
                      ((long)&(pBVar4->args_).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      + 8);
          if (ppVar11 != local_b8) {
            do {
              puVar10 = *(uint **)&(pBVar4->thread_counts_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl;
              puVar9 = *(uint **)((long)&(pBVar4->thread_counts_).
                                         super__Vector_base<int,_std::allocator<int>_> + 8);
              if (puVar10 == puVar9) {
                puVar9 = (uint *)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                puVar10 = (uint *)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
              }
              for (; puVar10 != puVar9; puVar10 = puVar10 + 1) {
                uVar1 = *puVar10;
                local_110.name._M_dataplus._M_p = (pointer)&local_110.name.field_2;
                local_110.name._M_string_length = 0;
                local_110.name.field_2._M_local_buf[0] = '\0';
                std::__cxx11::string::_M_assign((string *)&local_110);
                local_110.benchmark =
                     (local_118->_M_t).
                     super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                     .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
                iVar2 = pBVar4->arg_count_;
                local_110.has_arg1 = 0 < iVar2;
                local_110.arg1 = ppVar11->first;
                local_110.has_arg2 = iVar2 == 2;
                local_110.arg2 = ppVar11->second;
                local_110.min_time = pBVar4->min_time_;
                local_110.use_real_time = pBVar4->use_real_time_;
                local_110.multithreaded =
                     *(pointer *)
                      &(pBVar4->thread_counts_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl !=
                     *(pointer *)
                      ((long)&(pBVar4->thread_counts_).super__Vector_base<int,_std::allocator<int>_>
                      + 8);
                local_110.threads = uVar1;
                if ((0 < iVar2) &&
                   (AppendHumanReadable(local_110.arg1,&local_110.name), 1 < pBVar4->arg_count_)) {
                  AppendHumanReadable(local_110.arg2,&local_110.name);
                }
                if (2.220446049250313e-16 <= ABS(pBVar4->min_time_)) {
                  StringPrintF_abi_cxx11_(&local_138,"/min_time:%0.3f");
                  std::__cxx11::string::_M_append
                            ((char *)&local_110,
                             CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                      local_138._M_dataplus._M_p._0_4_));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_)
                      != &local_138.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                             local_138._M_dataplus._M_p._0_4_));
                  }
                }
                if (pBVar4->use_real_time_ == true) {
                  std::__cxx11::string::append((char *)&local_110);
                }
                if (*(pointer *)
                     &(pBVar4->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    != *(pointer *)
                        ((long)&(pBVar4->thread_counts_).
                                super__Vector_base<int,_std::allocator<int>_> + 8)) {
                  StringPrintF_abi_cxx11_(&local_138,"/threads:%d",(ulong)(uint)local_110.threads);
                  std::__cxx11::string::_M_append
                            ((char *)&local_110,
                             CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                      local_138._M_dataplus._M_p._0_4_));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_)
                      != &local_138.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                             local_138._M_dataplus._M_p._0_4_));
                  }
                }
                bVar6 = Regex::Match(&local_58,&local_110.name);
                if (bVar6) {
                  std::
                  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                  ::push_back(local_b0,&local_110);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
                  operator_delete(local_110.name._M_dataplus._M_p);
                }
              }
              ppVar11 = ppVar11 + 1;
            } while (ppVar11 != local_b8);
          }
        }
        puVar7 = local_118 + 1;
      } while (puVar7 != local_c0);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_a8);
    if ((uint *)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not compile benchmark re: ",0x20);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  Regex::~Regex(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool BenchmarkFamilies::FindBenchmarks(
    const std::string& spec,
    std::vector<Benchmark::Instance>* benchmarks) {
  // Make regular expression out of command-line flag
  std::string error_msg;
  Regex re;
  if (!re.Init(spec, &error_msg)) {
    std::cerr << "Could not compile benchmark re: " << error_msg << std::endl;
    return false;
  }

  // Special list of thread counts to use when none are specified
  std::vector<int> one_thread;
  one_thread.push_back(1);

  MutexLock l(mutex_);
  for (std::unique_ptr<Benchmark>& bench_family : families_) {
    // Family was deleted or benchmark doesn't match
    if (!bench_family) continue;
    BenchmarkImp* family = bench_family->imp_;

    if (family->arg_count_ == -1) {
      family->arg_count_ = 0;
      family->args_.emplace_back(-1, -1);
    }
    for (auto const& args : family->args_) {
      const std::vector<int>* thread_counts =
        (family->thread_counts_.empty()
         ? &one_thread
         : &family->thread_counts_);
      for (int num_threads : *thread_counts) {

        Benchmark::Instance instance;
        instance.name = family->name_;
        instance.benchmark = bench_family.get();
        instance.has_arg1 = family->arg_count_ >= 1;
        instance.arg1 = args.first;
        instance.has_arg2 = family->arg_count_ == 2;
        instance.arg2 = args.second;
        instance.min_time = family->min_time_;
        instance.use_real_time = family->use_real_time_;
        instance.threads = num_threads;
        instance.multithreaded = !(family->thread_counts_.empty());

        // Add arguments to instance name
        if (family->arg_count_ >= 1) {
          AppendHumanReadable(instance.arg1, &instance.name);
        }
        if (family->arg_count_ >= 2) {
          AppendHumanReadable(instance.arg2, &instance.name);
        }
        if (!IsZero(family->min_time_)) {
          instance.name +=  StringPrintF("/min_time:%0.3f",  family->min_time_);
        }
        if (family->use_real_time_) {
          instance.name +=  "/real_time";
        }

        // Add the number of threads used to the name
        if (!family->thread_counts_.empty()) {
          instance.name += StringPrintF("/threads:%d", instance.threads);
        }

        if (re.Match(instance.name)) {
          benchmarks->push_back(instance);
        }
      }
    }
  }
  return true;
}